

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseSet<TypePair,_TypePairHasher,_32U>::insert
          (SmallDenseSet<TypePair,_TypePairHasher,_32U> *this,TypePair *key)

{
  TypePair *pTVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  TypePair local_50;
  TypePair *local_40;
  TypePair *item;
  uint i;
  uint local_2c;
  uint bucket;
  uint bucketMask;
  TypePair *local_18;
  TypePair *key_local;
  SmallDenseSet<TypePair,_TypePairHasher,_32U> *this_local;
  
  local_18 = key;
  key_local = (TypePair *)this;
  TypePair::TypePair((TypePair *)&bucket);
  bVar2 = TypePair::operator!=(key,(TypePair *)&bucket);
  if (!bVar2) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0xd9,
                  "void SmallDenseSet<TypePair, TypePairHasher, 32>::insert(const Key &) [Key = TypePair, Hasher = TypePairHasher, N = 32]"
                 );
  }
  if (this->bucketCount <= this->count + (this->count >> 2)) {
    rehash(this);
  }
  local_2c = this->bucketCount - 1;
  uVar3 = TypePairHasher::operator()((TypePairHasher *)((long)&item + 7),local_18);
  i = uVar3 & local_2c;
  item._0_4_ = 0;
  while( true ) {
    if (this->bucketCount <= (uint)item) {
      __assert_fail("!\"couldn\'t insert node\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                    ,0xf5,
                    "void SmallDenseSet<TypePair, TypePairHasher, 32>::insert(const Key &) [Key = TypePair, Hasher = TypePairHasher, N = 32]"
                   );
    }
    pTVar1 = this->data;
    uVar4 = (ulong)i;
    local_40 = pTVar1 + uVar4;
    TypePair::TypePair(&local_50);
    bVar2 = TypePair::operator==(pTVar1 + uVar4,&local_50);
    if (bVar2) break;
    bVar2 = TypePair::operator==(local_40,local_18);
    if (bVar2) {
      return;
    }
    i = i + (uint)item + 1 & local_2c;
    item._0_4_ = (uint)item + 1;
  }
  local_40->a = local_18->a;
  local_40->b = local_18->b;
  this->count = this->count + 1;
  return;
}

Assistant:

void insert(const Key& key)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
			{
				item = key;

				count++;
				return;
			}

			if(item == key)
				return;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}